

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hh
# Opt level: O0

void __thiscall
Variant<int,std::__cxx11::string,char_const*>::Variant<std::__cxx11::string,void>
          (Variant<int,std::__cxx11::string,char_const*> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  type_index local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  Variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *this_local;
  
  local_18 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::type_index::type_index((type_index *)(this + 0x20),(type_info *)&void::typeinfo);
  Variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::destroy((Variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
             *)this,(type_index *)(this + 0x20),this);
  std::__cxx11::string::string((string *)this,(string *)local_18);
  std::type_index::type_index(&local_20,(type_info *)&std::__cxx11::string::typeinfo);
  *(type_info **)(this + 0x20) = local_20._M_target;
  return;
}

Assistant:

Variant(T&& value) : type_index_(typeid(void))
	{
			destroy(type_index_, &data_);
			typedef typename std::decay<T>::type U;
			new(&data_) U(std::forward<T>(value));
			type_index_ = std::type_index(typeid(U));
	}